

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

Vec_Int_t * Acb_NtkCollectTfoSideInputs(Acb_Ntk_t *p,int Pivot,Vec_Int_t *vTfo)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  p_00 = Vec_IntAlloc(100);
  Acb_NtkIncTravId(p);
  Vec_IntPush(vTfo,Pivot);
  for (iVar4 = 0; iVar1 = vTfo->nSize, iVar4 < iVar1; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(vTfo,iVar4);
    Acb_ObjSetTravIdCur(p,iVar1);
  }
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(vTfo,iVar4);
    piVar3 = Acb_ObjFanins(p,iVar1);
    for (lVar5 = 0; lVar5 < *piVar3; lVar5 = lVar5 + 1) {
      iVar1 = piVar3[lVar5 + 1];
      iVar2 = Acb_ObjSetTravIdCur(p,iVar1);
      if ((iVar1 != Pivot) && (iVar2 == 0)) {
        Vec_IntPush(p_00,iVar1);
      }
    }
    iVar1 = vTfo->nSize;
  }
  Vec_IntPop(vTfo);
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkCollectTfoSideInputs( Acb_Ntk_t * p, int Pivot, Vec_Int_t * vTfo )
{
    Vec_Int_t * vSide  = Vec_IntAlloc( 100 );
    int i, k, Node, iFanin, * pFanins;
    Acb_NtkIncTravId( p );
    Vec_IntPush( vTfo, Pivot );
    Vec_IntForEachEntry( vTfo, Node, i )
        Acb_ObjSetTravIdCur( p, Node );
    Vec_IntForEachEntry( vTfo, Node, i )
        Acb_ObjForEachFaninFast( p, Node, pFanins, iFanin, k )
            if ( !Acb_ObjSetTravIdCur(p, iFanin) && iFanin != Pivot )
                Vec_IntPush( vSide, iFanin );
    Vec_IntPop( vTfo );
    return vSide;
}